

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  pointer pcVar1;
  
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00221b80;
  pcVar1 = (this->stdErr)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stdErr).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->stdOut)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->stdOut).field_2) {
    operator_delete(pcVar1);
  }
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->testInfo).lcaseTags);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->testInfo).tags);
  pcVar1 = (this->testInfo).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->testInfo).description.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->testInfo).className._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->testInfo).className.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->testInfo).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->testInfo).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() = default;